

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O0

bool __thiscall minihttp::HttpSocket::_OnUpdate(HttpSocket *this)

{
  bool bVar1;
  size_type sVar2;
  HttpSocket *this_local;
  
  bVar1 = TcpSocket::_OnUpdate(&this->super_TcpSocket);
  if (bVar1) {
    if (((((this->_inProgress & 1U) != 0) && ((this->_chunkedTransfer & 1U) == 0)) &&
        (this->_remaining == 0)) && (this->_status != 0)) {
      _FinishRequest(this);
    }
    sVar2 = std::
            queue<minihttp::Request,_std::deque<minihttp::Request,_std::allocator<minihttp::Request>_>_>
            ::size(&this->_requestQ);
    if (((sVar2 != 0) && (this->_remaining == 0)) &&
       (((this->_chunkedTransfer & 1U) == 0 && ((this->_inProgress & 1U) == 0)))) {
      _DequeueMore(this);
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool HttpSocket::_OnUpdate()
{
    if(!TcpSocket::_OnUpdate())
        return false;

    if(_inProgress && !_chunkedTransfer && !_remaining && _status)
        _FinishRequest();

    //traceprint("HttpSocket::_OnUpdate, Q = %d\n", (unsigned)_requestQ.size());

    // initiate transfer if queue is not empty, but the socket somehow forgot to proceed
    if(_requestQ.size() && !_remaining && !_chunkedTransfer && !_inProgress)
        _DequeueMore();

    return true;
}